

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O3

void __thiscall
tlx::CmdlineParser::add_bytes(CmdlineParser *this,string *longkey,uint64_t *dest,string *desc)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
  add_bytes(this,'\0',longkey,&local_50,dest,desc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void CmdlineParser::add_bytes(const std::string& longkey,
                              uint64_t& dest, const std::string& desc) {
    return add_bytes(0, longkey, "", dest, desc);
}